

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Analyze(Parse *pParse,Token *pName1,Token *pName2)

{
  sqlite3 *db;
  int iVar1;
  uint uVar2;
  char *zName;
  Index *pOnlyIdx;
  Table *pTab;
  Vdbe *p;
  char *zDb;
  int iDb;
  Token *pTableName;
  Token *local_30;
  
  db = pParse->db;
  iVar1 = sqlite3ReadSchema(pParse);
  if (iVar1 != 0) {
    return;
  }
  if (pName1 == (Token *)0x0) {
    iVar1 = db->nDb;
    if (0 < iVar1) {
      iDb = 0;
      do {
        if (iDb != 1) {
          analyzeDatabase(pParse,iDb);
          iVar1 = db->nDb;
        }
        iDb = iDb + 1;
      } while (iDb < iVar1);
    }
    goto LAB_00151a1a;
  }
  if (pName2->n == 0) {
    iVar1 = sqlite3FindDb(db,pName1);
    if (-1 < iVar1) {
      analyzeDatabase(pParse,iVar1);
      goto LAB_00151a1a;
    }
    zName = sqlite3NameFromToken(db,pName1);
    if (zName == (char *)0x0) goto LAB_00151a1a;
    pOnlyIdx = sqlite3FindIndex(db,zName,(char *)0x0);
    if (pOnlyIdx != (Index *)0x0) goto LAB_001519e2;
    zDb = (char *)0x0;
LAB_001519f8:
    pTab = sqlite3LocateTable(pParse,0,zName,zDb);
    if (pTab != (Table *)0x0) {
      pOnlyIdx = (Index *)0x0;
      goto LAB_00151a0a;
    }
  }
  else {
    uVar2 = sqlite3TwoPartName(pParse,pName1,pName2,&local_30);
    if ((int)uVar2 < 0) goto LAB_00151a1a;
    zDb = db->aDb[uVar2].zDbSName;
    zName = sqlite3NameFromToken(db,local_30);
    if (zName == (char *)0x0) goto LAB_00151a1a;
    pOnlyIdx = sqlite3FindIndex(db,zName,zDb);
    if (pOnlyIdx == (Index *)0x0) goto LAB_001519f8;
LAB_001519e2:
    pTab = pOnlyIdx->pTable;
LAB_00151a0a:
    analyzeTable(pParse,pTab,pOnlyIdx);
  }
  sqlite3DbFree(db,zName);
LAB_00151a1a:
  p = pParse->pVdbe;
  if ((p == (Vdbe *)0x0) && (p = allocVdbe(pParse), p == (Vdbe *)0x0)) {
    return;
  }
  sqlite3VdbeAddOp3(p,0x95,0,0,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Analyze(Parse *pParse, Token *pName1, Token *pName2){
  sqlite3 *db = pParse->db;
  int iDb;
  int i;
  char *z, *zDb;
  Table *pTab;
  Index *pIdx;
  Token *pTableName;
  Vdbe *v;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return;
  }

  assert( pName2!=0 || pName1==0 );
  if( pName1==0 ){
    /* Form 1:  Analyze everything */
    for(i=0; i<db->nDb; i++){
      if( i==1 ) continue;  /* Do not analyze the TEMP database */
      analyzeDatabase(pParse, i);
    }
  }else if( pName2->n==0 ){
    /* Form 2:  Analyze the database or table named */
    iDb = sqlite3FindDb(db, pName1);
    if( iDb>=0 ){
      analyzeDatabase(pParse, iDb);
    }else{
      z = sqlite3NameFromToken(db, pName1);
      if( z ){
        if( (pIdx = sqlite3FindIndex(db, z, 0))!=0 ){
          analyzeTable(pParse, pIdx->pTable, pIdx);
        }else if( (pTab = sqlite3LocateTable(pParse, 0, z, 0))!=0 ){
          analyzeTable(pParse, pTab, 0);
        }
        sqlite3DbFree(db, z);
      }
    }
  }else{
    /* Form 3: Analyze the fully qualified table name */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pTableName);
    if( iDb>=0 ){
      zDb = db->aDb[iDb].zDbSName;
      z = sqlite3NameFromToken(db, pTableName);
      if( z ){
        if( (pIdx = sqlite3FindIndex(db, z, zDb))!=0 ){
          analyzeTable(pParse, pIdx->pTable, pIdx);
        }else if( (pTab = sqlite3LocateTable(pParse, 0, z, zDb))!=0 ){
          analyzeTable(pParse, pTab, 0);
        }
        sqlite3DbFree(db, z);
      }
    }   
  }
  v = sqlite3GetVdbe(pParse);
  if( v ) sqlite3VdbeAddOp0(v, OP_Expire);
}